

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O3

_Bool abandonOrAcceptMessage
                (HTTPTRANSPORT_HANDLE_DATA *handleData,HTTPTRANSPORT_PERDEVICE_DATA *deviceData,
                char *ETag,IOTHUBMESSAGE_DISPOSITION_RESULT action)

{
  HTTPAPIEX_HANDLE pHVar1;
  HTTPAPIEX_SAS_HANDLE sasHandle;
  int iVar2;
  HTTP_HEADERS_RESULT HVar3;
  HTTPAPIEX_RESULT HVar4;
  STRING_HANDLE s1;
  size_t sVar5;
  STRING_HANDLE s2;
  LOGGER_LOG p_Var6;
  HTTP_HEADERS_HANDLE pHVar7;
  char *pcVar8;
  char *pcVar9;
  _Bool _Var10;
  uint statusCode;
  uint local_3c;
  HTTP_HEADERS_HANDLE local_38;
  
  s1 = STRING_clone(deviceData->abandonHTTPrelativePathBegin);
  if (s1 == (STRING_HANDLE)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"abandonOrAcceptMessage",0x6bc,1,"unable to STRING_clone");
      return false;
    }
    return false;
  }
  sVar5 = strlen(ETag);
  s2 = STRING_construct_n(ETag + 1,sVar5 - 2);
  if (s2 == (STRING_HANDLE)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      _Var10 = false;
    }
    else {
      _Var10 = false;
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"abandonOrAcceptMessage",0x6c4,1,"unable to STRING_construct_n");
    }
    goto LAB_0012c8a4;
  }
  iVar2 = STRING_concat_with_STRING(s1,s2);
  if (iVar2 == 0) {
    pcVar9 = "?api-version=2016-11-14";
    if (action == IOTHUBMESSAGE_REJECTED) {
      pcVar9 = "?api-version=2016-11-14&reject";
    }
    pcVar8 = "/abandon?api-version=2016-11-14";
    if (action != IOTHUBMESSAGE_ABANDONED) {
      pcVar8 = pcVar9;
    }
    iVar2 = STRING_concat(s1,pcVar8);
    if (iVar2 != 0) goto LAB_0012c52b;
    pHVar7 = HTTPHeaders_Alloc();
    if (pHVar7 == (HTTP_HEADERS_HANDLE)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0012c78f;
      pcVar9 = "unable to HTTPHeaders_Alloc";
      iVar2 = 0x6d6;
      goto LAB_0012c55a;
    }
    local_38 = pHVar7;
    pcVar8 = (*(handleData->transport_callbacks).prod_info_cb)(handleData->transport_ctx);
    pcVar9 = "iothubclient/1.15.0";
    if (pcVar8 != (char *)0x0) {
      pcVar9 = pcVar8;
    }
    HVar3 = HTTPHeaders_AddHeaderNameValuePair(local_38,"User-Agent",pcVar9);
    if (((HVar3 == HTTP_HEADERS_OK) &&
        (HVar3 = HTTPHeaders_AddHeaderNameValuePair(local_38,"Authorization"," "),
        HVar3 == HTTP_HEADERS_OK)) &&
       (HVar3 = HTTPHeaders_AddHeaderNameValuePair(local_38,"If-Match",ETag),
       HVar3 == HTTP_HEADERS_OK)) {
      local_3c = 0;
      if (deviceData->deviceSasToken != (STRING_HANDLE)0x0) {
        pcVar9 = STRING_c_str(deviceData->deviceSasToken);
        pHVar7 = local_38;
        HVar3 = HTTPHeaders_ReplaceHeaderNameValuePair(local_38,"Authorization",pcVar9);
        if (HVar3 == HTTP_HEADERS_OK) {
          pHVar1 = handleData->httpApiExHandle;
          pcVar9 = STRING_c_str(s1);
          HVar4 = HTTPAPIEX_ExecuteRequest
                            (pHVar1,(uint)(action != IOTHUBMESSAGE_ABANDONED) * 2 +
                                    HTTPAPI_REQUEST_POST,pcVar9,pHVar7,(BUFFER_HANDLE)0x0,&local_3c,
                             (HTTP_HEADERS_HANDLE)0x0,(BUFFER_HANDLE)0x0);
          if (HVar4 == HTTPAPIEX_OK) goto LAB_0012c7e4;
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0012c890;
          pcVar9 = "Unable to HTTPAPIEX_ExecuteRequest.";
          iVar2 = 0x6fa;
        }
        else {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 == (LOGGER_LOG)0x0) {
LAB_0012c890:
            _Var10 = false;
            goto LAB_0012c892;
          }
          pcVar9 = "Unable to replace the old SAS Token.";
          iVar2 = 0x6ed;
        }
        goto LAB_0012c74f;
      }
      sasHandle = deviceData->sasObject;
      pHVar1 = handleData->httpApiExHandle;
      pcVar9 = STRING_c_str(s1);
      HVar4 = HTTPAPIEX_SAS_ExecuteRequest
                        (sasHandle,pHVar1,
                         (uint)(action != IOTHUBMESSAGE_ABANDONED) * 2 + HTTPAPI_REQUEST_POST,pcVar9
                         ,local_38,(BUFFER_HANDLE)0x0,&local_3c,(HTTP_HEADERS_HANDLE)0x0,
                         (BUFFER_HANDLE)0x0);
      if (HVar4 != HTTPAPIEX_OK) {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0012c890;
        pcVar9 = "unable to HTTPAPIEX_SAS_ExecuteRequest";
        iVar2 = 0x709;
        goto LAB_0012c74f;
      }
LAB_0012c7e4:
      _Var10 = true;
      if (local_3c != 0xcc) {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0012c890;
        pcVar9 = "unexpected status code returned %u (was expecting 204)";
        iVar2 = 0x70f;
        goto LAB_0012c74f;
      }
    }
    else {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0012c890;
      pcVar9 = "unable to HTTPHeaders_AddHeaderNameValuePair";
      iVar2 = 0x6e1;
LAB_0012c74f:
      _Var10 = false;
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"abandonOrAcceptMessage",iVar2,1,pcVar9);
    }
LAB_0012c892:
    HTTPHeaders_Free(local_38);
  }
  else {
LAB_0012c52b:
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
LAB_0012c78f:
      _Var10 = false;
    }
    else {
      pcVar9 = "unable to STRING_concat";
      iVar2 = 0x6ce;
LAB_0012c55a:
      _Var10 = false;
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"abandonOrAcceptMessage",iVar2,1,pcVar9);
    }
  }
  STRING_delete(s2);
LAB_0012c8a4:
  STRING_delete(s1);
  return _Var10;
}

Assistant:

static bool abandonOrAcceptMessage(HTTPTRANSPORT_HANDLE_DATA* handleData, HTTPTRANSPORT_PERDEVICE_DATA* deviceData, const char* ETag, IOTHUBMESSAGE_DISPOSITION_RESULT action)
{
    bool result;
    STRING_HANDLE fullAbandonRelativePath = STRING_clone(deviceData->abandonHTTPrelativePathBegin);
    if (fullAbandonRelativePath == NULL)
    {
        LogError("unable to STRING_clone");
        result = false;
    }
    else
    {
        STRING_HANDLE ETagUnquoted = STRING_construct_n(ETag + 1, strlen(ETag) - 2); /*skip first character which is '"' and the last one (which is also '"')*/
        if (ETagUnquoted == NULL)
        {
            LogError("unable to STRING_construct_n");
            result = false;
        }
        else
        {
            if (!(
                (STRING_concat_with_STRING(fullAbandonRelativePath, ETagUnquoted) == 0) &&
                (STRING_concat(fullAbandonRelativePath, (action == IOTHUBMESSAGE_ABANDONED) ? "/abandon" API_VERSION : ((action == IOTHUBMESSAGE_REJECTED) ? API_VERSION "&reject" : API_VERSION)) == 0)
                ))
            {
                LogError("unable to STRING_concat");
                result = false;
            }
            else
            {
                HTTP_HEADERS_HANDLE abandonRequestHttpHeaders = HTTPHeaders_Alloc();
                if (abandonRequestHttpHeaders == NULL)
                {
                    LogError("unable to HTTPHeaders_Alloc");
                    result = false;
                }
                else
                {
                    if (!(
                        (addUserAgentHeaderInfo(handleData, abandonRequestHttpHeaders) == HTTP_HEADERS_OK) &&
                        (HTTPHeaders_AddHeaderNameValuePair(abandonRequestHttpHeaders, IOTHUB_AUTH_HEADER_VALUE, " ") == HTTP_HEADERS_OK) &&
                        (HTTPHeaders_AddHeaderNameValuePair(abandonRequestHttpHeaders, "If-Match", ETag) == HTTP_HEADERS_OK)
                        ))
                    {
                        LogError("unable to HTTPHeaders_AddHeaderNameValuePair");
                        result = false;
                    }
                    else
                    {
                        unsigned int statusCode = 0;
                        HTTPAPIEX_RESULT r;
                        if (deviceData->deviceSasToken != NULL)
                        {
                            if (HTTPHeaders_ReplaceHeaderNameValuePair(abandonRequestHttpHeaders, IOTHUB_AUTH_HEADER_VALUE, STRING_c_str(deviceData->deviceSasToken)) != HTTP_HEADERS_OK)
                            {
                                r = HTTPAPIEX_ERROR;
                                LogError("Unable to replace the old SAS Token.");
                            }
                            else if ((r = HTTPAPIEX_ExecuteRequest(
                                handleData->httpApiExHandle,
                                (action == IOTHUBMESSAGE_ABANDONED) ? HTTPAPI_REQUEST_POST : HTTPAPI_REQUEST_DELETE,                               /*-requestType: POST                                                                                                       */
                                STRING_c_str(fullAbandonRelativePath),              /*-relativePath: abandon relative path begin (as created by _Create) + value of ETag + "/abandon?api-version=2016-11-14"   */
                                abandonRequestHttpHeaders,                          /*- requestHttpHeadersHandle: an HTTP headers instance containing the following                                            */
                                NULL,                                               /*- requestContent: NULL                                                                                                   */
                                &statusCode,                                         /*- statusCode: a pointer to unsigned int which might be examined for logging                                              */
                                NULL,                                               /*- responseHeadearsHandle: NULL                                                                                           */
                                NULL                                                /*- responseContent: NULL]                                                                                                 */
                            )) != HTTPAPIEX_OK)
                            {
                                LogError("Unable to HTTPAPIEX_ExecuteRequest.");
                            }
                        }
                        else if ((r = HTTPAPIEX_SAS_ExecuteRequest(
                            deviceData->sasObject,
                            handleData->httpApiExHandle,
                            (action == IOTHUBMESSAGE_ABANDONED) ? HTTPAPI_REQUEST_POST : HTTPAPI_REQUEST_DELETE,                               /*-requestType: POST                                                                                                       */
                            STRING_c_str(fullAbandonRelativePath),              /*-relativePath: abandon relative path begin (as created by _Create) + value of ETag + "/abandon?api-version=2016-11-14"   */
                            abandonRequestHttpHeaders,                          /*- requestHttpHeadersHandle: an HTTP headers instance containing the following                                            */
                            NULL,                                               /*- requestContent: NULL                                                                                                   */
                            &statusCode,                                         /*- statusCode: a pointer to unsigned int which might be examined for logging                                              */
                            NULL,                                               /*- responseHeadearsHandle: NULL                                                                                           */
                            NULL                                                /*- responseContent: NULL]                                                                                                 */
                        )) != HTTPAPIEX_OK)
                        {
                            LogError("unable to HTTPAPIEX_SAS_ExecuteRequest");
                        }
                        if (r == HTTPAPIEX_OK)
                        {
                            if (statusCode != 204)
                            {
                                LogError("unexpected status code returned %u (was expecting 204)", statusCode);
                                result = false;
                            }
                            else
                            {
                                /*all is fine*/
                                result = true;
                            }
                        }
                        else
                        {
                            result = false;
                        }
                    }
                    HTTPHeaders_Free(abandonRequestHttpHeaders);
                }
            }
            STRING_delete(ETagUnquoted);
        }
        STRING_delete(fullAbandonRelativePath);
    }
    return result;
}